

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O0

int executemacro(int f,int n)

{
  int iVar1;
  PF funct;
  int local_20;
  int num;
  int flag;
  int j;
  int i;
  int n_local;
  int f_local;
  
  if ((macrodef == 0) && ((macrocount < 0x100 || (macro[0xff].m_funct == finishmacro)))) {
    if (macrocount == 0) {
      n_local = 1;
    }
    else {
      inmacro = 1;
      for (flag = n; 0 < flag; flag = flag + -1) {
        maclcur = maclhead->l_fp;
        local_20 = 0;
        funct._4_4_ = 1;
        for (num = 0; num < macrocount + -1; num = num + 1) {
          if (macro[num].m_funct == universal_argument) {
            local_20 = 7;
            num = num + 1;
            funct._4_4_ = macro[num].m_count;
          }
          else {
            iVar1 = (*macro[num].m_funct)(local_20,funct._4_4_);
            if (iVar1 != 1) {
              inmacro = 0;
              return 0;
            }
            lastflag = thisflag;
            thisflag = 0;
            local_20 = 0;
            funct._4_4_ = 1;
          }
        }
      }
      inmacro = 0;
      n_local = 1;
    }
  }
  else {
    dobeep();
    ewprintf("Macro too long. Aborting.");
    n_local = 0;
  }
  return n_local;
}

Assistant:

int
executemacro(int f, int n)
{
	int	 i, j, flag, num;
	PF	 funct;

	if (macrodef ||
	    (macrocount >= MAXMACRO && macro[MAXMACRO - 1].m_funct
	    != finishmacro)) {
		dobeep();
		ewprintf("Macro too long. Aborting.");
		return (FALSE);
	}

	if (macrocount == 0)
		return (TRUE);

	inmacro = TRUE;

	for (i = n; i > 0; i--) {
		maclcur = maclhead->l_fp;
		flag = 0;
		num = 1;
		for (j = 0; j < macrocount - 1; j++) {
			funct = macro[j].m_funct;
			if (funct == universal_argument) {
				flag = FFARG;
				num = macro[++j].m_count;
				continue;
			}
			if ((*funct)(flag, num) != TRUE) {
				inmacro = FALSE;
				return (FALSE);
			}
			lastflag = thisflag;
			thisflag = 0;
			flag = 0;
			num = 1;
		}
	}
	inmacro = FALSE;
	return (TRUE);
}